

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O2

void __thiscall
OpenMD::GCNSeq::GCNSeq
          (GCNSeq *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType rCut,
          int bins)

{
  ostream *poVar1;
  string paramString;
  stringstream params;
  string local_1d0;
  RealType local_1b0;
  undefined1 local_1a8 [392];
  
  local_1b0 = rCut;
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer = (_func_int **)&PTR__GCNSeq_00221ab0;
  this->rCut_ = local_1b0;
  this->bins_ = bins;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"Generalized Coordination Number Distribution",
             (allocator<char> *)&local_1d0);
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).sequenceType_);
  std::__cxx11::string::~string((string *)local_1a8);
  getPrefix(&local_1d0,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 &local_1d0,".gcnSeq");
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&local_1d0);
  this->nnMax_ = 0xc;
  this->delta_ = 18.0 / (double)this->bins_;
  this->usePBC_ =
       (bool)(info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::operator<<((ostream *)(local_1a8 + 0x10)," rcut = ");
  poVar1 = std::ostream::_M_insert<double>(this->rCut_);
  poVar1 = std::operator<<(poVar1,", nbins = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->bins_);
  poVar1 = std::operator<<(poVar1,", max neighbors = ");
  std::ostream::operator<<((ostream *)poVar1,this->nnMax_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).paramString_);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  return;
}

Assistant:

GCNSeq::GCNSeq(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 RealType rCut, int bins) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      rCut_(rCut), bins_(bins) {
    setSequenceType("Generalized Coordination Number Distribution");
    setOutputName(getPrefix(filename) + ".gcnSeq");

    nnMax_           = 12;
    RealType binMax_ = nnMax_ * 1.5;
    delta_           = binMax_ / bins_;
    usePBC_          = info->getSimParams()->getUsePeriodicBoundaryConditions();

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << bins_
           << ", max neighbors = " << nnMax_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }